

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void V_InitFonts(void)

{
  int iVar1;
  FSingleLumpFont *pFVar2;
  FFont *pFVar3;
  int lump;
  int i;
  
  V_InitCustomFonts();
  SmallFont = FFont::FindFont("SmallFont");
  if (SmallFont == (FFont *)0x0) {
    iVar1 = FWadCollection::CheckNumForName(&Wads,"SMALLFNT");
    if (iVar1 < 0) {
      iVar1 = FWadCollection::CheckNumForName(&Wads,"FONTA_S");
      if (iVar1 < 0) {
        pFVar3 = (FFont *)operator_new(0x60);
        FFont::FFont(pFVar3,"SmallFont","STCFN%.3d",0x21,0xdf,0x21,-1,-1);
        SmallFont = pFVar3;
      }
      else {
        pFVar3 = (FFont *)operator_new(0x60);
        FFont::FFont(pFVar3,"SmallFont","FONTA%02u",0x21,0xdf,1,-1,-1);
        SmallFont = pFVar3;
        FFont::SetCursor(pFVar3,'[');
      }
    }
    else {
      pFVar2 = (FSingleLumpFont *)operator_new(0x368);
      FSingleLumpFont::FSingleLumpFont(pFVar2,"SmallFont",iVar1);
      SmallFont = (FFont *)pFVar2;
    }
  }
  SmallFont2 = FFont::FindFont("SmallFont2");
  if (SmallFont2 == (FFont *)0x0) {
    iVar1 = FWadCollection::CheckNumForName(&Wads,"STBFN033",0xf);
    if (iVar1 < 0) {
      SmallFont2 = SmallFont;
    }
    else {
      pFVar3 = (FFont *)operator_new(0x60);
      FFont::FFont(pFVar3,"SmallFont2","STBFN%.3d",0x21,0xdf,0x21,-1,-1);
      SmallFont2 = pFVar3;
    }
  }
  BigFont = FFont::FindFont("BigFont");
  if (BigFont == (FFont *)0x0) {
    iVar1 = FWadCollection::CheckNumForName(&Wads,"BIGFONT");
    if (iVar1 < 0) {
      if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
        if (gameinfo.gametype == GAME_Strife) {
          pFVar2 = (FSingleLumpFont *)operator_new(0x368);
          iVar1 = FWadCollection::GetNumForName(&Wads,"SBIGFONT");
          FSingleLumpFont::FSingleLumpFont(pFVar2,"BigFont",iVar1);
          BigFont = (FFont *)pFVar2;
        }
        else {
          iVar1 = FWadCollection::CheckNumForName(&Wads,"HBIGFONT");
          if (iVar1 < 0) {
            pFVar3 = (FFont *)operator_new(0x60);
            FFont::FFont(pFVar3,"BigFont","FONTB%02u",0x21,0xdf,1,-1,-1);
            BigFont = pFVar3;
          }
          else {
            pFVar2 = (FSingleLumpFont *)operator_new(0x368);
            FSingleLumpFont::FSingleLumpFont(pFVar2,"BigFont",iVar1);
            BigFont = (FFont *)pFVar2;
          }
        }
      }
      else {
        pFVar2 = (FSingleLumpFont *)operator_new(0x368);
        iVar1 = FWadCollection::GetNumForName(&Wads,"DBIGFONT");
        FSingleLumpFont::FSingleLumpFont(pFVar2,"BigFont",iVar1);
        BigFont = (FFont *)pFVar2;
      }
    }
    else {
      pFVar2 = (FSingleLumpFont *)operator_new(0x368);
      FSingleLumpFont::FSingleLumpFont(pFVar2,"BigFont",iVar1);
      BigFont = (FFont *)pFVar2;
    }
  }
  ConFont = FFont::FindFont("ConsoleFont");
  if (ConFont == (FFont *)0x0) {
    pFVar2 = (FSingleLumpFont *)operator_new(0x368);
    iVar1 = FWadCollection::GetNumForName(&Wads,"CONFONT");
    FSingleLumpFont::FSingleLumpFont(pFVar2,"ConsoleFont",iVar1);
    ConFont = (FFont *)pFVar2;
  }
  IntermissionFont = FFont::FindFont("IntermissionFont");
  if (IntermissionFont == (FFont *)0x0) {
    if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
      IntermissionFont = FFont::FindFont("IntermissionFont_Doom");
    }
    if (IntermissionFont == (FFont *)0x0) {
      IntermissionFont = BigFont;
    }
  }
  return;
}

Assistant:

void V_InitFonts()
{
	V_InitCustomFonts ();

	// load the heads-up font
	if (!(SmallFont = FFont::FindFont("SmallFont")))
	{
		int i;

		if ((i = Wads.CheckNumForName("SMALLFNT")) >= 0)
		{
			SmallFont = new FSingleLumpFont("SmallFont", i);
		}
		else if (Wads.CheckNumForName ("FONTA_S") >= 0)
		{
			SmallFont = new FFont ("SmallFont", "FONTA%02u", HU_FONTSTART, HU_FONTSIZE, 1, -1);
			SmallFont->SetCursor('[');
		}
		else
		{
			SmallFont = new FFont ("SmallFont", "STCFN%.3d", HU_FONTSTART, HU_FONTSIZE, HU_FONTSTART, -1);
		}
	}
	if (!(SmallFont2 = FFont::FindFont("SmallFont2")))	// Only used by Strife
	{
		if (Wads.CheckNumForName ("STBFN033", ns_graphics) >= 0)
		{
			SmallFont2 = new FFont ("SmallFont2", "STBFN%.3d", HU_FONTSTART, HU_FONTSIZE, HU_FONTSTART, -1);
		}
		else
		{
			SmallFont2 = SmallFont;
		}
	}
	if (!(BigFont = FFont::FindFont("BigFont")))
	{
		int lump = Wads.CheckNumForName("BIGFONT");
		if (lump >= 0)
		{
			BigFont = new FSingleLumpFont("BigFont", lump);
		}
		else if (gameinfo.gametype & GAME_DoomChex)
		{
			BigFont = new FSingleLumpFont ("BigFont", Wads.GetNumForName ("DBIGFONT"));
		}
		else if (gameinfo.gametype == GAME_Strife)
		{
			BigFont = new FSingleLumpFont ("BigFont", Wads.GetNumForName ("SBIGFONT"));
		}
		else
		{
			lump = Wads.CheckNumForName("HBIGFONT");
			if (lump >= 0)
			{
				BigFont = new FSingleLumpFont("BigFont", lump);
			}
			else
			{
				BigFont = new FFont ("BigFont", "FONTB%02u", HU_FONTSTART, HU_FONTSIZE, 1, -1);
			}
		}
	}
	if (!(ConFont = FFont::FindFont("ConsoleFont")))
	{
		ConFont = new FSingleLumpFont ("ConsoleFont", Wads.GetNumForName ("CONFONT"));
	}
	if (!(IntermissionFont = FFont::FindFont("IntermissionFont")))
	{
		if (gameinfo.gametype & GAME_DoomChex)
		{
			IntermissionFont = FFont::FindFont("IntermissionFont_Doom");
		}
		if (IntermissionFont == NULL)
		{
			IntermissionFont = BigFont;
		}
	}
}